

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O2

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultSchema
          (string *__return_storage_ptr__,CatalogSearchPath *this,string *catalog)

{
  pointer pCVar1;
  bool bVar2;
  pointer __lhs;
  allocator local_29;
  
  __lhs = (this->paths).
          super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
          super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->paths).
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pCVar1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"main",&local_29);
      return __return_storage_ptr__;
    }
    bVar2 = ::std::operator==(&__lhs->catalog,"temp");
    if ((!bVar2) && (bVar2 = StringUtil::CIEquals(&__lhs->catalog,catalog), bVar2)) break;
    __lhs = __lhs + 1;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&__lhs->schema);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchPath::GetDefaultSchema(const string &catalog) const {
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.catalog, catalog)) {
			return path.schema;
		}
	}
	return DEFAULT_SCHEMA;
}